

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O1

ZeroCopyInputStream * __thiscall
google::protobuf::compiler::DiskSourceTree::OpenVirtualFile
          (DiskSourceTree *this,string_view virtual_file,string *disk_file)

{
  bool bVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  size_type sVar5;
  ZeroCopyInputStream *pZVar6;
  int *piVar7;
  char *pcVar8;
  char *pcVar9;
  compiler *this_00;
  size_type __rlen;
  pointer pMVar10;
  bool bVar11;
  string_view filename;
  string_view path;
  string_view old_prefix;
  string_view filename_00;
  string_view new_prefix;
  string temp_disk_file;
  string local_f8;
  ZeroCopyInputStream *local_d8;
  string *local_d0;
  string *local_c8;
  pointer local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  undefined1 local_b0 [48];
  undefined1 local_80 [32];
  basic_string_view<char,_std::char_traits<char>_> local_60 [3];
  
  path._M_len = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)virtual_file._M_str;
  this_00 = (compiler *)virtual_file._M_len;
  path._M_str = (char *)disk_file;
  CanonicalizePath_abi_cxx11_((string *)local_b0,this_00,path);
  uVar2 = local_b0._0_8_;
  if ((compiler *)local_b0._8_8_ == this_00) {
    if (this_00 == (compiler *)0x0) {
LAB_001c7c3e:
      if ((this_00 < (compiler *)0x3) ||
         ((bVar11 = true, *(char *)((long)path._M_len + 2) != '/' || *(short *)path._M_len != 0x2e2e
          && ((this_00 < (compiler *)0x3 ||
              (this_00[(long)((long)path._M_len + -1)] != (compiler)0x2e ||
               *(short *)(this_00 + (long)((long)path._M_len + -3)) != 0x2e2f)))))) {
        local_60[0]._M_len = (size_t)this_00;
        local_60[0]._M_str = (char *)path._M_len;
        sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::find(local_60,"/../",0,4);
        bVar11 = sVar5 != 0xffffffffffffffff;
      }
    }
    else {
      iVar4 = bcmp(path._M_len,(void *)local_b0._0_8_,(size_t)this_00);
      if (iVar4 != 0) goto LAB_001c7bfb;
      if ((this_00 != (compiler *)0x2) || (iVar4 = bcmp(path._M_len,"..",2), iVar4 != 0))
      goto LAB_001c7c3e;
      bVar11 = true;
    }
    if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
      operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
    }
    if (!bVar11) {
      pMVar10 = (this->mappings_).
                super__Vector_base<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_c0 = (this->mappings_).
                 super__Vector_base<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      bVar11 = pMVar10 == local_c0;
      local_c8 = disk_file;
      local_b8 = path._M_len;
      if (!bVar11) {
        local_d0 = (string *)&this->last_error_message_;
        do {
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          local_f8._M_string_length = 0;
          local_f8.field_2._M_local_buf[0] = '\0';
          old_prefix._M_str = (pMVar10->virtual_path)._M_dataplus._M_p;
          old_prefix._M_len = (pMVar10->virtual_path)._M_string_length;
          filename_00._M_str = (char *)local_b8;
          filename_00._M_len = (size_t)this_00;
          new_prefix._M_str = (pMVar10->disk_path)._M_dataplus._M_p;
          new_prefix._M_len = (pMVar10->disk_path)._M_string_length;
          bVar3 = ApplyMapping(filename_00,old_prefix,new_prefix,&local_f8);
          bVar1 = true;
          if (bVar3) {
            filename._M_str = local_f8._M_dataplus._M_p;
            filename._M_len = local_f8._M_string_length;
            pZVar6 = OpenDiskFile(this,filename);
            if (pZVar6 == (ZeroCopyInputStream *)0x0) {
              piVar7 = __errno_location();
              if (*piVar7 == 0xd) {
                local_b0._0_8_ = (pointer)0x20;
                local_b0._8_8_ = "Read access is denied for file: ";
                local_60[0]._M_len = local_f8._M_string_length;
                local_60[0]._M_str = local_f8._M_dataplus._M_p;
                absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_80,(AlphaNum *)local_b0);
                std::__cxx11::string::operator=(local_d0,(string *)local_80);
                if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
                  operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
                }
                bVar1 = false;
                local_d8 = (ZeroCopyInputStream *)0x0;
              }
            }
            else {
              if (local_c8 != (string *)0x0) {
                std::__cxx11::string::_M_assign((string *)local_c8);
              }
              bVar1 = false;
              local_d8 = pZVar6;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,
                            CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                                     local_f8.field_2._M_local_buf[0]) + 1);
          }
          if (!bVar1) break;
          pMVar10 = pMVar10 + 1;
          bVar11 = pMVar10 == local_c0;
        } while (!bVar11);
      }
      if (!bVar11) {
        return local_d8;
      }
      pcVar9 = (char *)(this->last_error_message_)._M_string_length;
      pcVar8 = "File not found.";
      goto LAB_001c7cde;
    }
  }
  else {
LAB_001c7bfb:
    if ((undefined1 *)uVar2 != local_b0 + 0x10) {
      operator_delete((void *)uVar2,local_b0._16_8_ + 1);
    }
  }
  pcVar9 = (char *)(this->last_error_message_)._M_string_length;
  pcVar8 = "Backslashes, consecutive slashes, \".\", or \"..\" are not allowed in the virtual path";
LAB_001c7cde:
  std::__cxx11::string::_M_replace((ulong)&this->last_error_message_,0,pcVar9,(ulong)pcVar8);
  return (ZeroCopyInputStream *)0x0;
}

Assistant:

io::ZeroCopyInputStream* DiskSourceTree::OpenVirtualFile(
    absl::string_view virtual_file, std::string* disk_file) {
  if (virtual_file != CanonicalizePath(virtual_file) ||
      ContainsParentReference(virtual_file)) {
    // We do not allow importing of paths containing things like ".." or
    // consecutive slashes since the compiler expects files to be uniquely
    // identified by file name.
    last_error_message_ =
        "Backslashes, consecutive slashes, \".\", or \"..\" "
        "are not allowed in the virtual path";
    return nullptr;
  }

  for (const auto& mapping : mappings_) {
    std::string temp_disk_file;
    if (ApplyMapping(virtual_file, mapping.virtual_path, mapping.disk_path,
                     &temp_disk_file)) {
      io::ZeroCopyInputStream* stream = OpenDiskFile(temp_disk_file);
      if (stream != nullptr) {
        if (disk_file != nullptr) {
          *disk_file = temp_disk_file;
        }
        return stream;
      }

      if (errno == EACCES) {
        // The file exists but is not readable.
        last_error_message_ =
            absl::StrCat("Read access is denied for file: ", temp_disk_file);
        return nullptr;
      }
    }
  }
  last_error_message_ = "File not found.";
  return nullptr;
}